

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_set_num_data_bits(cio_uart *port,cio_uart_num_data_bits num_data_bits)

{
  undefined1 local_58 [4];
  cio_error err;
  termios tty;
  cio_uart_num_data_bits num_data_bits_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty.c_ispeed = num_data_bits;
    unique0x100000b0 = port;
    port_local._4_4_ = get_current_settings(port,(termios *)local_58);
    if (port_local._4_4_ == CIO_SUCCESS) {
      switch(tty.c_ispeed) {
      case 0:
        break;
      case 1:
        tty.c_iflag = tty.c_iflag | 0x10;
        break;
      case 2:
        tty.c_iflag = tty.c_iflag | 0x20;
        break;
      case 3:
        tty.c_iflag = tty.c_iflag | 0x30;
        break;
      default:
        return CIO_INVALID_ARGUMENT;
      }
      port_local._4_4_ = set_termios((stack0xffffffffffffffe8->impl).ev.fd,(termios *)local_58);
      if (port_local._4_4_ == CIO_SUCCESS) {
        port_local._4_4_ = CIO_SUCCESS;
      }
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_set_num_data_bits(const struct cio_uart *port, enum cio_uart_num_data_bits num_data_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (num_data_bits) {
	case CIO_UART_5_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS5;
		break;
	case CIO_UART_6_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS6;
		break;
	case CIO_UART_7_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS7;
		break;
	case CIO_UART_8_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS8;
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}